

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::ConfigBase::from_config
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          ConfigBase *this,istream *input)

{
  pointer pCVar1;
  char cVar2;
  bool bVar3;
  __type _Var4;
  bool bVar5;
  istream *piVar6;
  long lVar7;
  char delimiter;
  char cVar8;
  string *psVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  string *str;
  uint local_18c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parents;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items_buffer;
  string section;
  string local_f8;
  istream *local_d8;
  string line;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  local_d8 = input;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section,"default",(allocator<char> *)&name);
  (__return_storage_ptr__->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18c = (uint)this->arrayStart;
  if ((local_18c & 0xdf) == 0) {
    cVar2 = this->arrayEnd;
    if (this->arrayStart == cVar2) {
      cVar2 = ']';
      bVar5 = true;
      local_18c = 0x5b;
      goto LAB_0010f5ff;
    }
  }
  else {
    cVar2 = this->arrayEnd;
  }
  bVar5 = false;
LAB_0010f5ff:
  cVar8 = this->arraySeparator;
  delimiter = ',';
  if (cVar8 != ' ') {
    delimiter = cVar8;
  }
  if (!bVar5) {
    delimiter = cVar8;
  }
  do {
    piVar6 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (local_d8,(string *)&line);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
      bVar5 = ::std::operator!=(&section,"default");
      if (bVar5) {
        name._M_dataplus._M_p = (pointer)&name.field_2;
        name._M_string_length = 0;
        name.field_2._M_local_buf[0] = '\0';
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                  (__return_storage_ptr__);
        detail::generate_parents(&parents,&section,&name);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&(__return_storage_ptr__->
                          super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                          _M_impl.super__Vector_impl_data._M_finish[-1].parents,&parents);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&parents);
        ::std::__cxx11::string::assign
                  ((char *)&(__return_storage_ptr__->
                            super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                            _M_impl.super__Vector_impl_data._M_finish[-1].name);
        while (pCVar1 = (__return_storage_ptr__->
                        super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                        _M_impl.super__Vector_impl_data._M_finish,
              0x20 < (ulong)((long)pCVar1[-1].parents.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)pCVar1[-1].parents.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::push_back
                    (__return_storage_ptr__,pCVar1 + -1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(&(__return_storage_ptr__->
                      super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl
                      .super__Vector_impl_data._M_finish[-1].parents);
        }
        ::std::__cxx11::string::~string((string *)&name);
      }
      ::std::__cxx11::string::~string((string *)&section);
      ::std::__cxx11::string::~string((string *)&line);
      return __return_storage_ptr__;
    }
    items_buffer.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    items_buffer.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    items_buffer.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    detail::trim(&line);
    if (line._M_string_length < 2) {
      if (line._M_string_length != 0) {
        cVar8 = *line._M_dataplus._M_p;
        goto LAB_0010f809;
      }
    }
    else {
      cVar8 = *line._M_dataplus._M_p;
      if (cVar8 == '[') {
        cVar8 = '[';
        if (line._M_dataplus._M_p[line._M_string_length - 1] == ']') {
          bVar3 = ::std::operator!=(&section,"default");
          if (bVar3) {
            std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                      (__return_storage_ptr__);
            detail::generate_parents(&parents,&section,&name);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_move_assign(&(__return_storage_ptr__->
                              super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)
                              ._M_impl.super__Vector_impl_data._M_finish[-1].parents,&parents);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&parents);
            ::std::__cxx11::string::assign
                      ((char *)&(__return_storage_ptr__->
                                super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                                )._M_impl.super__Vector_impl_data._M_finish[-1].name);
          }
          ::std::__cxx11::string::substr((ulong)&parents,(ulong)&line);
          ::std::__cxx11::string::operator=((string *)&section,(string *)&parents);
          ::std::__cxx11::string::~string((string *)&parents);
          if (((1 < section._M_string_length) && (*section._M_dataplus._M_p == '[')) &&
             (section._M_dataplus._M_p[section._M_string_length - 1] == ']')) {
            ::std::__cxx11::string::substr((ulong)&parents,(ulong)&section);
            ::std::__cxx11::string::operator=((string *)&section,(string *)&parents);
            ::std::__cxx11::string::~string((string *)&parents);
          }
          ::std::__cxx11::string::string((string *)&local_50,(string *)&section);
          detail::to_lower((string *)&parents,&local_50);
          bVar3 = ::std::operator==((string *)&parents,"default");
          ::std::__cxx11::string::~string((string *)&parents);
          ::std::__cxx11::string::~string((string *)&local_50);
          if (bVar3) {
            ::std::__cxx11::string::assign((char *)&section);
          }
          else {
            detail::checkParentSegments(__return_storage_ptr__,&section);
          }
          goto LAB_0010fb86;
        }
      }
      else {
LAB_0010f809:
        if ((cVar8 == '#') || (cVar8 == ';')) goto LAB_0010fb86;
      }
      if (cVar8 != this->commentChar) {
        lVar7 = ::std::__cxx11::string::find((char)&line,(ulong)(uint)(int)this->valueDelimiter);
        if (lVar7 == -1) {
          detail::trim_copy((string *)&parents,&line);
          ::std::__cxx11::string::operator=((string *)&name,(string *)&parents);
          ::std::__cxx11::string::~string((string *)&parents);
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&parents,"true",(allocator<char> *)&local_f8);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_assign_aux<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &items_buffer,(string *)&parents,&name);
        }
        else {
          ::std::__cxx11::string::substr((ulong)&local_f8,(ulong)&line);
          detail::trim_copy((string *)&parents,&local_f8);
          ::std::__cxx11::string::operator=((string *)&name,(string *)&parents);
          ::std::__cxx11::string::~string((string *)&parents);
          ::std::__cxx11::string::~string((string *)&local_f8);
          ::std::__cxx11::string::substr((ulong)&local_f8,(ulong)&line);
          detail::trim_copy((string *)&parents,&local_f8);
          ::std::__cxx11::string::~string((string *)&local_f8);
          if (((parents.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish < (pointer)0x2) ||
              (local_18c !=
               (int)*(char *)&((parents.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p)) ||
             (cVar2 != (parents.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].field_2._M_local_buf + 0xf)
                       [(long)parents.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish])) {
            if (bVar5) {
              cVar8 = (char)(string *)&parents;
              lVar7 = ::std::__cxx11::string::find(cVar8,(ulong)(uint)(int)delimiter);
              if (lVar7 != -1) {
                psVar9 = &local_90;
                ::std::__cxx11::string::string((string *)psVar9,(string *)&parents);
                detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_f8,psVar9,delimiter);
                goto LAB_0010f96e;
              }
              lVar7 = ::std::__cxx11::string::find(cVar8,0x20);
              if (lVar7 == -1) goto LAB_0010fa4b;
              psVar9 = &local_b0;
              ::std::__cxx11::string::string((string *)psVar9,(string *)&parents);
              detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_f8,psVar9,'\0');
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_move_assign(&items_buffer,&local_f8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_f8);
            }
            else {
LAB_0010fa4b:
              psVar9 = &local_f8;
              ::std::__cxx11::string::string((string *)psVar9,(string *)&parents);
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<std::__cxx11::string_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &items_buffer,psVar9,&local_d8);
            }
          }
          else {
            psVar9 = &local_70;
            ::std::__cxx11::string::substr((ulong)psVar9,(ulong)&parents);
            detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_f8,psVar9,delimiter);
LAB_0010f96e:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_move_assign(&items_buffer,&local_f8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_f8);
          }
          ::std::__cxx11::string::~string((string *)psVar9);
        }
        ::std::__cxx11::string::~string((string *)&parents);
        lVar7 = ::std::__cxx11::string::find((char)&name,0x2e);
        str = items_buffer.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        psVar9 = items_buffer.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (lVar7 == -1) {
          detail::remove_quotes(&name);
          str = items_buffer.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
          psVar9 = items_buffer.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; str != psVar9; str = str + 1) {
          detail::remove_quotes(str);
        }
        detail::generate_parents(&parents,&section,&name);
        pCVar1 = (__return_storage_ptr__->
                 super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((((__return_storage_ptr__->
              super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
              super__Vector_impl_data._M_start == pCVar1) ||
            (_Var4 = ::std::operator==(&name,&pCVar1[-1].name), !_Var4)) ||
           (bVar3 = ::std::operator==(&parents,&(__return_storage_ptr__->
                                                super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                                                )._M_impl.super__Vector_impl_data._M_finish[-1].
                                                parents), !bVar3)) {
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                    (__return_storage_ptr__);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_move_assign(&(__return_storage_ptr__->
                            super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                            _M_impl.super__Vector_impl_data._M_finish[-1].parents,&parents);
          ::std::__cxx11::string::operator=
                    ((string *)
                     &(__return_storage_ptr__->
                      super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl
                      .super__Vector_impl_data._M_finish[-1].name,(string *)&name);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_move_assign(&(__return_storage_ptr__->
                            super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                            _M_impl.super__Vector_impl_data._M_finish[-1].inputs,&items_buffer);
        }
        else {
          pCVar1 = (__return_storage_ptr__->
                   super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &pCVar1[-1].inputs,
                     pCVar1[-1].inputs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )items_buffer.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )items_buffer.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&parents);
      }
    }
LAB_0010fb86:
    ::std::__cxx11::string::~string((string *)&name);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&items_buffer);
  } while( true );
}

Assistant:

inline std::vector<ConfigItem> ConfigBase::from_config(std::istream &input) const {
    std::string line;
    std::string section = "default";

    std::vector<ConfigItem> output;
    bool defaultArray = (arrayStart == '\0' || arrayStart == ' ') && arrayStart == arrayEnd;
    char aStart = (defaultArray) ? '[' : arrayStart;
    char aEnd = (defaultArray) ? ']' : arrayEnd;
    char aSep = (defaultArray && arraySeparator == ' ') ? ',' : arraySeparator;

    while(getline(input, line)) {
        std::vector<std::string> items_buffer;
        std::string name;

        detail::trim(line);
        std::size_t len = line.length();
        if(len > 1 && line.front() == '[' && line.back() == ']') {
            if(section != "default") {
                // insert a section end which is just an empty items_buffer
                output.emplace_back();
                output.back().parents = detail::generate_parents(section, name);
                output.back().name = "--";
            }
            section = line.substr(1, len - 2);
            // deal with double brackets for TOML
            if(section.size() > 1 && section.front() == '[' && section.back() == ']') {
                section = section.substr(1, section.size() - 2);
            }
            if(detail::to_lower(section) == "default") {
                section = "default";
            } else {
                detail::checkParentSegments(output, section);
            }
            continue;
        }
        if(len == 0) {
            continue;
        }
        // comment lines
        if(line.front() == ';' || line.front() == '#' || line.front() == commentChar) {
            continue;
        }

        // Find = in string, split and recombine
        auto pos = line.find(valueDelimiter);
        if(pos != std::string::npos) {
            name = detail::trim_copy(line.substr(0, pos));
            std::string item = detail::trim_copy(line.substr(pos + 1));
            if(item.size() > 1 && item.front() == aStart && item.back() == aEnd) {
                items_buffer = detail::split_up(item.substr(1, item.length() - 2), aSep);
            } else if(defaultArray && item.find_first_of(aSep) != std::string::npos) {
                items_buffer = detail::split_up(item, aSep);
            } else if(defaultArray && item.find_first_of(' ') != std::string::npos) {
                items_buffer = detail::split_up(item);
            } else {
                items_buffer = {item};
            }
        } else {
            name = detail::trim_copy(line);
            items_buffer = {"true"};
        }
        if(name.find('.') == std::string::npos) {
            detail::remove_quotes(name);
        }
        // clean up quotes on the items
        for(auto &it : items_buffer) {
            detail::remove_quotes(it);
        }

        std::vector<std::string> parents = detail::generate_parents(section, name);

        if(!output.empty() && name == output.back().name && parents == output.back().parents) {
            output.back().inputs.insert(output.back().inputs.end(), items_buffer.begin(), items_buffer.end());
        } else {
            output.emplace_back();
            output.back().parents = std::move(parents);
            output.back().name = std::move(name);
            output.back().inputs = std::move(items_buffer);
        }
    }
    if(section != "default") {
        // insert a section end which is just an empty items_buffer
        std::string ename;
        output.emplace_back();
        output.back().parents = detail::generate_parents(section, ename);
        output.back().name = "--";
        while(output.back().parents.size() > 1) {
            output.push_back(output.back());
            output.back().parents.pop_back();
        }
    }
    return output;
}